

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# farchive.cpp
# Opt level: O2

void __thiscall FCompressedFile::Implode(FCompressedFile *this)

{
  uint uVar1;
  int iVar2;
  uchar *puVar3;
  uint *puVar4;
  uint uVar5;
  size_t __n;
  uchar *block;
  uchar *__src;
  size_t sVar6;
  size_t local_40;
  uchar *local_38;
  
  uVar1 = this->m_BufferSize;
  __n = (size_t)uVar1;
  block = this->m_Buffer;
  uVar5 = uVar1;
  if ((nofilecompression.Value) || (this->m_NoCompress != false)) {
    local_40 = 0;
    puVar3 = (uchar *)0x0;
  }
  else {
    local_40 = __n + __n / 1000 + 0xc;
    local_38 = block;
    while( true ) {
      puVar3 = (uchar *)operator_new__(local_40);
      iVar2 = compress(puVar3,&local_40,block,__n);
      if (iVar2 != -5) break;
      operator_delete__(puVar3);
      local_40 = local_40 + 0x400;
      block = this->m_Buffer;
    }
    if ((iVar2 == 0) && (local_40 < __n)) {
      DPrintf(4,"cfile shrank from %lu to %lu bytes\n",__n);
      sVar6 = local_40;
      if (local_40 == 0) {
        sVar6 = __n;
      }
      block = local_38;
      uVar5 = (uint)sVar6;
    }
    else {
      DPrintf(4,"cfile could not be compressed\n");
      local_40 = 0;
      block = local_38;
    }
  }
  this->m_BufferSize = uVar5;
  this->m_MaxBufferSize = uVar5;
  puVar4 = (uint *)M_Malloc_Dbg((ulong)(uVar5 + 8),
                                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/farchive.cpp"
                                ,0x173);
  this->m_Buffer = (uchar *)puVar4;
  this->m_Pos = 0;
  uVar5 = (uint)local_40;
  *puVar4 = uVar5 >> 0x18 | (uVar5 & 0xff0000) >> 8 | (uVar5 & 0xff00) << 8 | uVar5 << 0x18;
  puVar4[1] = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
  __src = block;
  if (local_40 != 0) {
    __n = local_40;
    __src = puVar3;
  }
  memcpy(puVar4 + 2,__src,__n);
  if (puVar3 != (uchar *)0x0) {
    operator_delete__(puVar3);
  }
  M_Free(block);
  return;
}

Assistant:

void FCompressedFile::Implode ()
{
	uLong outlen;
	uLong len = m_BufferSize;
	Byte *compressed = NULL;
	BYTE *oldbuf = m_Buffer;
	int r;

	if (!nofilecompression && !m_NoCompress)
	{
		outlen = OUT_LEN(len);
		do
		{
			compressed = new Bytef[outlen];
			r = compress (compressed, &outlen, m_Buffer, len);
			if (r == Z_BUF_ERROR)
			{
				delete[] compressed;
				outlen += 1024;
			}
		} while (r == Z_BUF_ERROR);

		// If the data could not be compressed, store it as-is.
		if (r != Z_OK || outlen >= len)
		{
			DPrintf (DMSG_SPAMMY, "cfile could not be compressed\n");
			outlen = 0;
		}
		else
		{
			DPrintf (DMSG_SPAMMY, "cfile shrank from %lu to %lu bytes\n", len, outlen);
		}
	}
	else
	{
		outlen = 0;
	}

	m_MaxBufferSize = m_BufferSize = ((outlen == 0) ? len : outlen);
	m_Buffer = (BYTE *)M_Malloc (m_BufferSize + 8);
	m_Pos = 0;

	DWORD *lens = (DWORD *)(m_Buffer);
	lens[0] = BigLong((unsigned int)outlen);
	lens[1] = BigLong((unsigned int)len);

	if (outlen == 0)
		memcpy (m_Buffer + 8, oldbuf, len);
	else
		memcpy (m_Buffer + 8, compressed, outlen);
	if (compressed)
		delete[] compressed;
	M_Free (oldbuf);
}